

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSIXEnvironment.h
# Opt level: O1

char ** __thiscall llbuild::basic::POSIXEnvironment::getEnvp(POSIXEnvironment *this)

{
  pointer *pppcVar1;
  pointer ppcVar2;
  pointer pbVar3;
  iterator iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *entry;
  pointer pbVar5;
  char *local_28;
  
  this->isFrozen = true;
  ppcVar2 = (this->env).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->env).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar2) {
    (this->env).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar2;
  }
  pbVar3 = (this->envStorage).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (this->envStorage).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar3; pbVar5 = pbVar5 + 1) {
    local_28 = (pbVar5->_M_dataplus)._M_p;
    iVar4._M_current =
         (this->env).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (this->env).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)this,iVar4,&local_28);
    }
    else {
      *iVar4._M_current = local_28;
      pppcVar1 = &(this->env).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  local_28 = (char *)0x0;
  iVar4._M_current =
       (this->env).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->env).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<decltype(nullptr)>
              ((vector<char_const*,std::allocator<char_const*>> *)this,iVar4,&local_28);
  }
  else {
    *iVar4._M_current = (char *)0x0;
    pppcVar1 = &(this->env).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return (this->env).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_start;
}

Assistant:

const char* const* getEnvp() {
    isFrozen = true;

    // Form the final environment.
    env.clear();
    for (const auto& entry : envStorage) {
      env.emplace_back(entry.c_str());
    }
    env.emplace_back(nullptr);
    return env.data();
  }